

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::OP_InvalidateCachedScope(void *varEnv,int32 envIndex)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *pRVar3;
  undefined4 *puVar4;
  
  pRVar3 = (RecyclableObject *)FrameDisplay::GetItem((FrameDisplay *)varEnv,envIndex);
  if (pRVar3 == (RecyclableObject *)0x0) {
    return;
  }
  if ((ulong)pRVar3 >> 0x30 == 0) {
    bVar2 = VarIsImpl<Js::ActivationObjectEx>(pRVar3);
    if (bVar2) goto LAB_00ac29f3;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,0x17ac,"(VarIs<ActivationObjectEx>(item))",
                              "VarIs<ActivationObjectEx>(item)");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00ac29f3:
  pRVar3 = VarTo<Js::RecyclableObject>(pRVar3);
  (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x59])(pRVar3);
  return;
}

Assistant:

void JavascriptOperators::OP_InvalidateCachedScope(void* varEnv, int32 envIndex)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(OP_InvalidateCachedScope);
        FrameDisplay *disp = (FrameDisplay*)varEnv;
        Var item = disp->GetItem(envIndex);
        if (item != nullptr)
        {
            Assert(VarIs<ActivationObjectEx>(item));
            RecyclableObject *objScope = VarTo<RecyclableObject>(item);
            objScope->InvalidateCachedScope();
        }
        JIT_HELPER_END(OP_InvalidateCachedScope);
    }